

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O0

void Dau_TablesSave(int nInputs,int nVars,Vec_Mem_t *vTtMem,Vec_Int_t *vNodSup,int nFronts,
                   abctime clk)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  FILE *__s;
  word *__ptr;
  int *__ptr_00;
  abctime aVar4;
  int local_ac;
  int nWords;
  int i;
  char FileName [100];
  FILE *pFile;
  abctime clk_local;
  int nFronts_local;
  Vec_Int_t *vNodSup_local;
  Vec_Mem_t *vTtMem_local;
  int nVars_local;
  int nInputs_local;
  
  iVar1 = Abc_TtWordNum(nInputs);
  sprintf((char *)&nWords,"npn%d%d.ttd",(ulong)(uint)nInputs,(ulong)(uint)nVars);
  __s = fopen((char *)&nWords,"wb");
  local_ac = 0;
  while( true ) {
    iVar2 = Vec_MemEntryNum(vTtMem);
    if (iVar2 <= local_ac) break;
    __ptr = Vec_MemReadEntry(vTtMem,local_ac);
    fwrite(__ptr,8,(long)iVar1,__s);
    local_ac = local_ac + 1;
  }
  __ptr_00 = Vec_IntArray(vNodSup);
  iVar1 = Vec_IntSize(vNodSup);
  fwrite(__ptr_00,4,(long)iVar1,__s);
  fclose(__s);
  uVar3 = Vec_IntSize(vNodSup);
  printf("Dumped file \"%s\" with %10d classes after exploring %10d frontiers.  ",&nWords,
         (ulong)uVar3,(ulong)(uint)nFronts);
  aVar4 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar4 - clk);
  fflush(_stdout);
  return;
}

Assistant:

void Dau_TablesSave( int nInputs, int nVars, Vec_Mem_t * vTtMem, Vec_Int_t * vNodSup, int nFronts, abctime clk )
{
    FILE * pFile; 
    char FileName[100];
    int i, nWords = Abc_TtWordNum(nInputs);
    // NPN classes
    sprintf( FileName, "npn%d%d.ttd", nInputs, nVars );
    pFile = fopen( FileName, "wb" );
    for ( i = 0; i < Vec_MemEntryNum(vTtMem); i++ )
        fwrite( Vec_MemReadEntry(vTtMem, i), 8, nWords, pFile );
    fwrite( Vec_IntArray(vNodSup), 4, Vec_IntSize(vNodSup), pFile );
    fclose( pFile );
//    printf( "Dumped files with %10d classes after exploring %10d frontiers.\n", 
//        Vec_IntSize(vNodSup), nFronts );
    printf( "Dumped file \"%s\" with %10d classes after exploring %10d frontiers.  ", 
        FileName, Vec_IntSize(vNodSup), nFronts );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    fflush(stdout);
}